

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O0

void __thiscall soplex::SPxSolverBase<double>::reinitializeVecs(SPxSolverBase<double> *this)

{
  Type TVar1;
  Representation RVar2;
  SPxSolverBase<double> *in_RDI;
  SPxSolverBase<double> *unaff_retaddr;
  SPxSolverBase<double> *in_stack_00000020;
  SPxSolverBase<double> *in_stack_00000050;
  SPxSolverBase<double> *in_stack_00000070;
  SPxSolverBase<double> *in_stack_00000080;
  SPxSolverBase<double> *in_stack_00000090;
  SPxSolverBase<double> *x;
  
  in_RDI->initialized = true;
  x = in_RDI;
  TVar1 = type(in_RDI);
  if (TVar1 == ENTER) {
    RVar2 = rep(in_RDI);
    if (RVar2 == COLUMN) {
      setPrimalBounds(unaff_retaddr);
    }
    else {
      setDualRowBounds(in_stack_00000020);
    }
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x8d])();
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7c])();
  }
  else {
    RVar2 = rep(in_RDI);
    if (RVar2 == ROW) {
      setPrimalBounds(unaff_retaddr);
    }
    else {
      setDualColBounds(in_stack_00000050);
    }
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x8e])();
    (*(in_RDI->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7d])();
  }
  SPxBasisBase<double>::coSolve
            ((SPxBasisBase<double> *)unaff_retaddr,(VectorBase<double> *)x,
             (VectorBase<double> *)in_RDI);
  computePvec(unaff_retaddr);
  computeFrhs(in_stack_00000090);
  SPxBasisBase<double>::solve
            ((SPxBasisBase<double> *)unaff_retaddr,(VectorBase<double> *)x,
             (VectorBase<double> *)in_RDI);
  in_RDI->theShift = 0.0;
  in_RDI->lastShift = 0.0;
  TVar1 = type(in_RDI);
  if (TVar1 == ENTER) {
    computeCoTest(in_stack_00000070);
    computeTest(in_stack_00000070);
  }
  else {
    computeFtest(in_stack_00000080);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::reinitializeVecs()
   {

      initialized = true;

      if(type() == ENTER)
      {
         if(rep() == COLUMN)
            setPrimalBounds();
         else
            setDualRowBounds();

         setEnterBounds();
         computeEnterCoPrhs();
      }
      else
      {
         if(rep() == ROW)
            setPrimalBounds();
         else
            setDualColBounds();

         setLeaveBounds();
         computeLeaveCoPrhs();
      }

      SPxBasisBase<R>::coSolve(*theCoPvec, *theCoPrhs);
      computePvec();
      computeFrhs();
      SPxBasisBase<R>::solve(*theFvec, *theFrhs);

      theShift  = 0.0;
      lastShift = 0.0;

      if(type() == ENTER)
      {
         computeCoTest();
         computeTest();
      }
      else
      {
         computeFtest();
      }

      assert((testBounds(), 1));
   }